

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

ssize_t nghttp2_session_mem_send_internal(nghttp2_session *session,uint8_t **data_ptr,int fast_cb)

{
  nghttp2_outbound_item *pnVar1;
  nghttp2_buf_chain *pnVar2;
  int iVar3;
  int iVar4;
  nghttp2_mem *mem_00;
  nghttp2_active_outbound_item *aob_00;
  nghttp2_bufs *framebufs_00;
  nghttp2_frame *frame_00;
  nghttp2_stream *stream_00;
  uint8_t *puVar5;
  nghttp2_buf *buf_1;
  size_t datalen_1;
  int pause;
  nghttp2_frame *frame_2;
  nghttp2_stream *stream;
  nghttp2_buf *buf;
  size_t datalen;
  uint32_t local_70;
  int rv2_1;
  uint32_t error_code_1;
  int32_t opened_stream_id_1;
  nghttp2_frame *frame_1;
  int rv2;
  nghttp2_frame *frame;
  uint32_t error_code;
  int32_t opened_stream_id;
  nghttp2_outbound_item *item;
  nghttp2_mem *mem;
  nghttp2_bufs *framebufs;
  nghttp2_active_outbound_item *aob;
  int rv;
  int fast_cb_local;
  uint8_t **data_ptr_local;
  nghttp2_session *session_local;
  
  mem_00 = &session->mem;
  aob_00 = &session->aob;
  framebufs_00 = &(session->aob).framebufs;
  iVar3 = nghttp2_session_adjust_idle_stream(session);
  iVar4 = nghttp2_is_fatal(iVar3);
  if (iVar4 != 0) {
    return (long)iVar3;
  }
  do {
    switch((session->aob).state) {
    case NGHTTP2_OB_POP_ITEM:
      frame_00 = &nghttp2_session_pop_next_ob_item(session)->frame;
      if (frame_00 == (nghttp2_frame *)0x0) {
        return 0;
      }
      aob._0_4_ = session_prep_frame(session,(nghttp2_outbound_item *)&frame_00->hd);
      if ((int)aob == -0x20e) {
        return 0;
      }
      if ((int)aob != -0x1fc) {
        if (-1 < (int)aob) {
          aob_00->item = (nghttp2_outbound_item *)frame_00;
          (session->aob).framebufs.cur = framebufs_00->head;
          if ((frame_00->hd).type == '\0') {
            if (*(char *)((long)frame_00 + 0x72) != '\0') {
              (session->aob).state = NGHTTP2_OB_SEND_NO_COPY;
              break;
            }
          }
          else {
            iVar3 = session_call_before_frame_send(session,frame_00);
            iVar4 = nghttp2_is_fatal(iVar3);
            if (iVar4 != 0) {
              return (long)iVar3;
            }
            if (iVar3 == -0x217) {
              rv2_1 = 0;
              local_70 = 2;
              if (((session->callbacks).on_frame_not_send_callback !=
                   (nghttp2_on_frame_not_send_callback)0x0) &&
                 (iVar3 = (*(session->callbacks).on_frame_not_send_callback)
                                    (session,frame_00,-0x217,session->user_data), iVar3 != 0)) {
                return -0x386;
              }
              if ((frame_00->hd).type == '\x01') {
                if ((frame_00->headers).cat == NGHTTP2_HCAT_REQUEST) {
                  rv2_1 = (frame_00->hd).stream_id;
                  local_70 = 7;
                }
              }
              else if ((frame_00->hd).type == '\x05') {
                rv2_1 = (frame_00->push_promise).promised_stream_id;
              }
              if (rv2_1 != 0) {
                iVar3 = nghttp2_session_close_stream(session,rv2_1,local_70);
                iVar4 = nghttp2_is_fatal(iVar3);
                if (iVar4 != 0) {
                  return (long)iVar3;
                }
              }
              active_outbound_item_reset(aob_00,mem_00);
              break;
            }
          }
          (session->aob).state = NGHTTP2_OB_SEND_DATA;
          break;
        }
        frame._4_4_ = 0;
        frame._0_4_ = 2;
        if (((((frame_00->hd).type != '\0') &&
             ((session->callbacks).on_frame_not_send_callback !=
              (nghttp2_on_frame_not_send_callback)0x0)) &&
            (iVar3 = is_non_fatal((int)aob), iVar3 != 0)) &&
           (((frame_00->hd).type != '\b' &&
            (iVar3 = (*(session->callbacks).on_frame_not_send_callback)
                               (session,frame_00,(int)aob,session->user_data), iVar3 != 0)))) {
          nghttp2_outbound_item_free((nghttp2_outbound_item *)&frame_00->hd,mem_00);
          nghttp2_mem_free(mem_00,frame_00);
          return -0x386;
        }
        if ((frame_00->hd).type == '\x01') {
          if ((frame_00->headers).cat == NGHTTP2_HCAT_REQUEST) {
            frame._4_4_ = (frame_00->hd).stream_id;
            if (*(char *)((long)frame_00 + 0x7c) == '\0') {
              frame._0_4_ = 7;
            }
            else {
              frame._0_4_ = *(uint32_t *)((long)frame_00 + 0x78);
            }
          }
        }
        else if ((frame_00->hd).type == '\x05') {
          frame._4_4_ = (frame_00->push_promise).promised_stream_id;
        }
        if (frame._4_4_ != 0) {
          iVar3 = nghttp2_session_close_stream(session,frame._4_4_,(uint32_t)frame);
          iVar4 = nghttp2_is_fatal(iVar3);
          if (iVar4 != 0) {
            return (long)iVar3;
          }
        }
        nghttp2_outbound_item_free((nghttp2_outbound_item *)&frame_00->hd,mem_00);
        nghttp2_mem_free(mem_00,frame_00);
        active_outbound_item_reset(aob_00,mem_00);
        if ((int)aob == -0x20b) {
          aob._0_4_ = nghttp2_session_terminate_session(session,2);
        }
        iVar3 = nghttp2_is_fatal((int)aob);
        if (iVar3 != 0) {
          return (long)(int)aob;
        }
      }
      break;
    case NGHTTP2_OB_SEND_DATA:
      pnVar2 = (session->aob).framebufs.cur;
      if ((pnVar2->buf).pos != (pnVar2->buf).last) {
        *data_ptr = (pnVar2->buf).pos;
        puVar5 = (pnVar2->buf).last + -(long)(pnVar2->buf).pos;
        (pnVar2->buf).pos = (pnVar2->buf).pos + (long)puVar5;
        return (ssize_t)puVar5;
      }
      if (fast_cb == 0) {
        iVar3 = session_after_frame_sent1(session);
        if (iVar3 < 0) {
          iVar4 = nghttp2_is_fatal(iVar3);
          if (iVar4 != 0) {
            return (long)iVar3;
          }
          __assert_fail("nghttp2_is_fatal(rv)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                        ,0xd8a,
                        "ssize_t nghttp2_session_mem_send_internal(nghttp2_session *, const uint8_t **, int)"
                       );
        }
        aob._0_4_ = session_after_frame_sent2(session);
      }
      else {
        aob._0_4_ = session_after_frame_sent2(session);
      }
      if ((int)aob < 0) {
        iVar3 = nghttp2_is_fatal((int)aob);
        if (iVar3 != 0) {
          return (long)(int)aob;
        }
        __assert_fail("nghttp2_is_fatal(rv)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                      ,0xd91,
                      "ssize_t nghttp2_session_mem_send_internal(nghttp2_session *, const uint8_t **, int)"
                     );
      }
      break;
    case NGHTTP2_OB_SEND_NO_COPY:
      pnVar1 = aob_00->item;
      stream_00 = nghttp2_session_get_stream(session,(pnVar1->frame).hd.stream_id);
      if (stream_00 == (nghttp2_stream *)0x0) {
        active_outbound_item_reset(aob_00,mem_00);
      }
      else {
        iVar3 = session_call_send_data(session,aob_00->item,framebufs_00);
        iVar4 = nghttp2_is_fatal(iVar3);
        if (iVar4 != 0) {
          return (long)iVar3;
        }
        if (iVar3 == -0x209) {
          iVar3 = session_detach_stream_item(session,stream_00);
          iVar4 = nghttp2_is_fatal(iVar3);
          if (iVar4 != 0) {
            return (long)iVar3;
          }
          iVar3 = nghttp2_session_add_rst_stream(session,(pnVar1->frame).hd.stream_id,2);
          iVar4 = nghttp2_is_fatal(iVar3);
          if (iVar4 != 0) {
            return (long)iVar3;
          }
          active_outbound_item_reset(aob_00,mem_00);
        }
        else {
          if (iVar3 == -0x1f8) {
            return 0;
          }
          iVar4 = session_after_frame_sent1(session);
          if (iVar4 < 0) {
            iVar3 = nghttp2_is_fatal(iVar4);
            if (iVar3 != 0) {
              return (long)iVar4;
            }
            __assert_fail("nghttp2_is_fatal(rv)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                          ,0xdd2,
                          "ssize_t nghttp2_session_mem_send_internal(nghttp2_session *, const uint8_t **, int)"
                         );
          }
          iVar4 = session_after_frame_sent2(session);
          if (iVar4 < 0) {
            iVar3 = nghttp2_is_fatal(iVar4);
            if (iVar3 != 0) {
              return (long)iVar4;
            }
            __assert_fail("nghttp2_is_fatal(rv)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                          ,0xdd7,
                          "ssize_t nghttp2_session_mem_send_internal(nghttp2_session *, const uint8_t **, int)"
                         );
          }
          if (iVar3 == -0x20e) {
            return 0;
          }
        }
      }
      break;
    case NGHTTP2_OB_SEND_CLIENT_MAGIC:
      pnVar2 = (session->aob).framebufs.cur;
      if ((pnVar2->buf).pos != (pnVar2->buf).last) {
        *data_ptr = (pnVar2->buf).pos;
        puVar5 = (pnVar2->buf).last + -(long)(pnVar2->buf).pos;
        (pnVar2->buf).pos = (pnVar2->buf).pos + (long)puVar5;
        return (ssize_t)puVar5;
      }
      active_outbound_item_reset(aob_00,mem_00);
    }
  } while( true );
}

Assistant:

static ssize_t nghttp2_session_mem_send_internal(nghttp2_session *session,
                                                 const uint8_t **data_ptr,
                                                 int fast_cb) {
  int rv;
  nghttp2_active_outbound_item *aob;
  nghttp2_bufs *framebufs;
  nghttp2_mem *mem;

  mem = &session->mem;
  aob = &session->aob;
  framebufs = &aob->framebufs;

  /* We may have idle streams more than we expect (e.g.,
     nghttp2_session_change_stream_priority() or
     nghttp2_session_create_idle_stream()).  Adjust them here. */
  rv = nghttp2_session_adjust_idle_stream(session);
  if (nghttp2_is_fatal(rv)) {
    return rv;
  }

  for (;;) {
    switch (aob->state) {
    case NGHTTP2_OB_POP_ITEM: {
      nghttp2_outbound_item *item;

      item = nghttp2_session_pop_next_ob_item(session);
      if (item == NULL) {
        return 0;
      }

      rv = session_prep_frame(session, item);
      if (rv == NGHTTP2_ERR_PAUSE) {
        return 0;
      }
      if (rv == NGHTTP2_ERR_DEFERRED) {
        DEBUGF("send: frame transmission deferred\n");
        break;
      }
      if (rv < 0) {
        int32_t opened_stream_id = 0;
        uint32_t error_code = NGHTTP2_INTERNAL_ERROR;

        DEBUGF("send: frame preparation failed with %s\n",
               nghttp2_strerror(rv));
        /* TODO If the error comes from compressor, the connection
           must be closed. */
        if (item->frame.hd.type != NGHTTP2_DATA &&
            session->callbacks.on_frame_not_send_callback && is_non_fatal(rv)) {
          nghttp2_frame *frame = &item->frame;
          /* The library is responsible for the transmission of
             WINDOW_UPDATE frame, so we don't call error callback for
             it. */
          if (frame->hd.type != NGHTTP2_WINDOW_UPDATE &&
              session->callbacks.on_frame_not_send_callback(
                  session, frame, rv, session->user_data) != 0) {

            nghttp2_outbound_item_free(item, mem);
            nghttp2_mem_free(mem, item);

            return NGHTTP2_ERR_CALLBACK_FAILURE;
          }
        }
        /* We have to close stream opened by failed request HEADERS
           or PUSH_PROMISE. */
        switch (item->frame.hd.type) {
        case NGHTTP2_HEADERS:
          if (item->frame.headers.cat == NGHTTP2_HCAT_REQUEST) {
            opened_stream_id = item->frame.hd.stream_id;
            if (item->aux_data.headers.canceled) {
              error_code = item->aux_data.headers.error_code;
            } else {
              /* Set error_code to REFUSED_STREAM so that application
                 can send request again. */
              error_code = NGHTTP2_REFUSED_STREAM;
            }
          }
          break;
        case NGHTTP2_PUSH_PROMISE:
          opened_stream_id = item->frame.push_promise.promised_stream_id;
          break;
        }
        if (opened_stream_id) {
          /* careful not to override rv */
          int rv2;
          rv2 = nghttp2_session_close_stream(session, opened_stream_id,
                                             error_code);

          if (nghttp2_is_fatal(rv2)) {
            return rv2;
          }
        }

        nghttp2_outbound_item_free(item, mem);
        nghttp2_mem_free(mem, item);
        active_outbound_item_reset(aob, mem);

        if (rv == NGHTTP2_ERR_HEADER_COMP) {
          /* If header compression error occurred, should terminiate
             connection. */
          rv = nghttp2_session_terminate_session(session,
                                                 NGHTTP2_INTERNAL_ERROR);
        }
        if (nghttp2_is_fatal(rv)) {
          return rv;
        }
        break;
      }

      aob->item = item;

      nghttp2_bufs_rewind(framebufs);

      if (item->frame.hd.type != NGHTTP2_DATA) {
        nghttp2_frame *frame;

        frame = &item->frame;

        DEBUGF("send: next frame: payloadlen=%zu, type=%u, flags=0x%02x, "
               "stream_id=%d\n",
               frame->hd.length, frame->hd.type, frame->hd.flags,
               frame->hd.stream_id);

        rv = session_call_before_frame_send(session, frame);
        if (nghttp2_is_fatal(rv)) {
          return rv;
        }

        if (rv == NGHTTP2_ERR_CANCEL) {
          int32_t opened_stream_id = 0;
          uint32_t error_code = NGHTTP2_INTERNAL_ERROR;

          if (session->callbacks.on_frame_not_send_callback) {
            if (session->callbacks.on_frame_not_send_callback(
                    session, frame, rv, session->user_data) != 0) {
              return NGHTTP2_ERR_CALLBACK_FAILURE;
            }
          }

          /* We have to close stream opened by canceled request
             HEADERS or PUSH_PROMISE. */
          switch (item->frame.hd.type) {
          case NGHTTP2_HEADERS:
            if (item->frame.headers.cat == NGHTTP2_HCAT_REQUEST) {
              opened_stream_id = item->frame.hd.stream_id;
              /* We don't have to check
                 item->aux_data.headers.canceled since it has already
                 been checked. */
              /* Set error_code to REFUSED_STREAM so that application
                 can send request again. */
              error_code = NGHTTP2_REFUSED_STREAM;
            }
            break;
          case NGHTTP2_PUSH_PROMISE:
            opened_stream_id = item->frame.push_promise.promised_stream_id;
            break;
          }
          if (opened_stream_id) {
            /* careful not to override rv */
            int rv2;
            rv2 = nghttp2_session_close_stream(session, opened_stream_id,
                                               error_code);

            if (nghttp2_is_fatal(rv2)) {
              return rv2;
            }
          }

          active_outbound_item_reset(aob, mem);

          break;
        }
      } else {
        DEBUGF("send: next frame: DATA\n");

        if (item->aux_data.data.no_copy) {
          aob->state = NGHTTP2_OB_SEND_NO_COPY;
          break;
        }
      }

      DEBUGF("send: start transmitting frame type=%u, length=%zd\n",
             framebufs->cur->buf.pos[3],
             framebufs->cur->buf.last - framebufs->cur->buf.pos);

      aob->state = NGHTTP2_OB_SEND_DATA;

      break;
    }
    case NGHTTP2_OB_SEND_DATA: {
      size_t datalen;
      nghttp2_buf *buf;

      buf = &framebufs->cur->buf;

      if (buf->pos == buf->last) {
        DEBUGF("send: end transmission of a frame\n");

        /* Frame has completely sent */
        if (fast_cb) {
          rv = session_after_frame_sent2(session);
        } else {
          rv = session_after_frame_sent1(session);
          if (rv < 0) {
            /* FATAL */
            assert(nghttp2_is_fatal(rv));
            return rv;
          }
          rv = session_after_frame_sent2(session);
        }
        if (rv < 0) {
          /* FATAL */
          assert(nghttp2_is_fatal(rv));
          return rv;
        }
        /* We have already adjusted the next state */
        break;
      }

      *data_ptr = buf->pos;
      datalen = nghttp2_buf_len(buf);

      /* We increment the offset here. If send_callback does not send
         everything, we will adjust it. */
      buf->pos += datalen;

      return (ssize_t)datalen;
    }
    case NGHTTP2_OB_SEND_NO_COPY: {
      nghttp2_stream *stream;
      nghttp2_frame *frame;
      int pause;

      DEBUGF("send: no copy DATA\n");

      frame = &aob->item->frame;

      stream = nghttp2_session_get_stream(session, frame->hd.stream_id);
      if (stream == NULL) {
        DEBUGF("send: no copy DATA cancelled because stream was closed\n");

        active_outbound_item_reset(aob, mem);

        break;
      }

      rv = session_call_send_data(session, aob->item, framebufs);
      if (nghttp2_is_fatal(rv)) {
        return rv;
      }

      if (rv == NGHTTP2_ERR_TEMPORAL_CALLBACK_FAILURE) {
        rv = session_detach_stream_item(session, stream);

        if (nghttp2_is_fatal(rv)) {
          return rv;
        }

        rv = nghttp2_session_add_rst_stream(session, frame->hd.stream_id,
                                            NGHTTP2_INTERNAL_ERROR);
        if (nghttp2_is_fatal(rv)) {
          return rv;
        }

        active_outbound_item_reset(aob, mem);

        break;
      }

      if (rv == NGHTTP2_ERR_WOULDBLOCK) {
        return 0;
      }

      pause = (rv == NGHTTP2_ERR_PAUSE);

      rv = session_after_frame_sent1(session);
      if (rv < 0) {
        assert(nghttp2_is_fatal(rv));
        return rv;
      }
      rv = session_after_frame_sent2(session);
      if (rv < 0) {
        assert(nghttp2_is_fatal(rv));
        return rv;
      }

      /* We have already adjusted the next state */

      if (pause) {
        return 0;
      }

      break;
    }
    case NGHTTP2_OB_SEND_CLIENT_MAGIC: {
      size_t datalen;
      nghttp2_buf *buf;

      buf = &framebufs->cur->buf;

      if (buf->pos == buf->last) {
        DEBUGF("send: end transmission of client magic\n");
        active_outbound_item_reset(aob, mem);
        break;
      }

      *data_ptr = buf->pos;
      datalen = nghttp2_buf_len(buf);

      buf->pos += datalen;

      return (ssize_t)datalen;
    }
    }
  }
}